

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssemblyCommand.cpp
# Opt level: O0

MoveMemFromRegPlusConstToReg * __thiscall
AssemblyCode::MoveMemFromRegPlusConstToReg::ToString_abi_cxx11_(MoveMemFromRegPlusConstToReg *this)

{
  int __val;
  long in_RSI;
  __cxx11 local_228 [32];
  CTemp local_208;
  CTemp local_1e8;
  string local_1c8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_188 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_168 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_148 [32];
  __cxx11 local_128 [32];
  CTemp local_108;
  CTemp local_d8;
  string local_b8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38 [40];
  MoveMemFromRegPlusConstToReg *this_local;
  
  this_local = this;
  if (*(int *)(in_RSI + 0x48) < 1) {
    IRT::CTemp::ToString_abi_cxx11_(&local_1e8);
    std::operator+((char *)local_1c8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)"mov ");
    std::operator+(local_1a8,(char *)local_1c8);
    IRT::CTemp::ToString_abi_cxx11_(&local_208);
    std::operator+(local_188,local_1a8);
    std::operator+(local_168,(char *)local_188);
    __val = *(int *)(in_RSI + 0x48);
    if (__val < 1) {
      __val = -__val;
    }
    std::__cxx11::to_string(local_228,__val);
    std::operator+(local_148,local_168);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this,
                   (char *)local_148);
    std::__cxx11::string::~string((string *)local_148);
    std::__cxx11::string::~string((string *)local_228);
    std::__cxx11::string::~string((string *)local_168);
    std::__cxx11::string::~string((string *)local_188);
    std::__cxx11::string::~string((string *)&local_208);
    std::__cxx11::string::~string((string *)local_1a8);
    std::__cxx11::string::~string(local_1c8);
    std::__cxx11::string::~string((string *)&local_1e8);
  }
  else {
    IRT::CTemp::ToString_abi_cxx11_(&local_d8);
    std::operator+((char *)local_b8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)"mov ");
    std::operator+(local_98,(char *)local_b8);
    IRT::CTemp::ToString_abi_cxx11_(&local_108);
    std::operator+(local_78,local_98);
    std::operator+(local_58,(char *)local_78);
    std::__cxx11::to_string(local_128,*(int *)(in_RSI + 0x48));
    std::operator+(local_38,local_58);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this,
                   (char *)local_38);
    std::__cxx11::string::~string((string *)local_38);
    std::__cxx11::string::~string((string *)local_128);
    std::__cxx11::string::~string((string *)local_58);
    std::__cxx11::string::~string((string *)local_78);
    std::__cxx11::string::~string((string *)&local_108);
    std::__cxx11::string::~string((string *)local_98);
    std::__cxx11::string::~string(local_b8);
    std::__cxx11::string::~string((string *)&local_d8);
  }
  return this;
}

Assistant:

std::string AssemblyCode::MoveMemFromRegPlusConstToReg::ToString( ) const {
    if (constant > 0) {
        return "mov " + target.ToString( ) + " [" + source.ToString( ) + " + " + std::to_string( constant ) + "]\n";
    } else {
        return "mov " + target.ToString( ) + " [" + source.ToString( ) + " - " + std::to_string( abs(constant) ) + "]\n";
    }
}